

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

SwapchainBuilder * __thiscall
vkb::SwapchainBuilder::use_default_present_mode_selection(SwapchainBuilder *this)

{
  pointer pVVar1;
  
  pVVar1 = (this->info).desired_present_modes.
           super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info).desired_present_modes.
      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->info).desired_present_modes.
    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  add_desired_present_modes(this,&(this->info).desired_present_modes);
  return this;
}

Assistant:

SwapchainBuilder& SwapchainBuilder::use_default_present_mode_selection() {
    info.desired_present_modes.clear();
    add_desired_present_modes(info.desired_present_modes);
    return *this;
}